

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::anon_unknown_0::ParseErrorTest_MsgReservedNameStringNotInEditions_Test::
ParseErrorTest_MsgReservedNameStringNotInEditions_Test
          (ParseErrorTest_MsgReservedNameStringNotInEditions_Test *this)

{
  ParseErrorTest_MsgReservedNameStringNotInEditions_Test *this_local;
  
  ParserTest::ParserTest(&this->super_ParseErrorTest);
  (this->super_ParseErrorTest).super_Test._vptr_Test =
       (_func_int **)&PTR__ParseErrorTest_MsgReservedNameStringNotInEditions_Test_02a0cb80;
  return;
}

Assistant:

TEST_F(ParseErrorTest, MsgReservedNameStringNotInEditions) {
  ExpectHasErrors(
      "edition = \"2023\";\n"
      "message TestMessage {\n"
      "  reserved \"foo\", \"bar\";\n"
      "}\n",
      "2:11: Reserved names must be identifiers in editions, not string "
      "literals.\n");
}